

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O0

MPP_RET store_cur_nalu(H264dCurCtx_t *p_Cur,H264dCurStream_t *p_strm,H264dDxvaCtx_t *dxva_ctx)

{
  h264d_input_ctx_t *phVar1;
  RK_U32 RVar2;
  RK_U8 *pRVar3;
  uint local_5c;
  H264dInputCtx_t *p_Inp;
  RK_U32 add_size_1;
  RK_U8 *p_tmp;
  RK_U32 add_size;
  RK_U32 head_size;
  RK_U8 *p_des;
  MPP_RET ret;
  H264dDxvaCtx_t *dxva_ctx_local;
  H264dCurStream_t *p_strm_local;
  H264dCurCtx_t *p_Cur_local;
  
  if (((((p_strm->nalu_type == 1) || (p_strm->nalu_type == 5)) || (p_strm->nalu_type == 7)) ||
      ((p_strm->nalu_type == 8 || (p_strm->nalu_type == 0xf)))) ||
     ((p_strm->nalu_type == 6 || ((p_strm->nalu_type == 0xe || (p_strm->nalu_type == 0x14)))))) {
    if (p_strm->nalu_len < 0x3200) {
      local_5c = p_strm->nalu_len;
    }
    else {
      local_5c = 0x3200;
    }
    RVar2 = local_5c + 8;
    if ((p_strm->tmp_offset != 0) && (p_strm->head_offset == 0)) {
      memcpy(p_strm->head_buf,p_strm->tmp_buf,(ulong)p_strm->tmp_offset);
      p_strm->head_offset = p_strm->tmp_offset + p_strm->head_offset;
      p_strm->tmp_offset = 0;
      if ((h264d_debug & 8) != 0) {
        _mpp_log_l(4,"h264d_parse","copy tmp header to empty header of new frame",(char *)0x0);
      }
    }
    if ((p_strm->head_offset + RVar2 < p_strm->head_max_size) ||
       (p_des._4_4_ = realloc_buffer(&p_strm->head_buf,&p_strm->head_max_size,RVar2),
       MPP_NOK < p_des._4_4_)) {
      pRVar3 = p_strm->head_buf + p_strm->head_offset;
      pRVar3[0] = '\0';
      pRVar3[1] = '\0';
      *(short *)(pRVar3 + 2) = (short)p_strm->nalu_type;
      *(uint *)(pRVar3 + 4) = local_5c;
      memcpy(pRVar3 + 8,p_strm->nalu_buf,(ulong)local_5c);
      p_strm->head_offset = RVar2 + p_strm->head_offset;
      if ((h264d_debug & 8) != 0) {
        _mpp_log_l(4,"h264d_parse","store current header, NAL type %d",(char *)0x0,
                   (ulong)(uint)p_strm->nalu_type);
      }
      if (((p_Cur->p_Dec->have_slice_data != '\0') && (p_strm->nalu_type != 5)) &&
         (p_strm->nalu_type != 1)) {
        if ((p_strm->tmp_max_size <= p_strm->tmp_offset + RVar2) &&
           (p_des._4_4_ = realloc_buffer(&p_strm->tmp_buf,&p_strm->tmp_max_size,RVar2),
           p_des._4_4_ < MPP_OK)) {
          if ((h264d_debug & 4) != 0) {
            _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x1a5);
          }
          goto LAB_001b9954;
        }
        memcpy(p_strm->tmp_buf + p_strm->tmp_offset,pRVar3,(ulong)RVar2);
        p_strm->tmp_offset = RVar2 + p_strm->tmp_offset;
        if ((h264d_debug & 8) != 0) {
          _mpp_log_l(4,"h264d_parse","store current header to tmp header, NAL type %d",(char *)0x0,
                     (ulong)(uint)p_strm->nalu_type);
        }
      }
      goto LAB_001b96e3;
    }
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x194);
    }
LAB_001b9954:
    p_Cur_local._4_4_ = p_des._4_4_;
  }
  else {
LAB_001b96e3:
    if ((p_strm->nalu_type == 1) || (p_strm->nalu_type == 5)) {
      RVar2 = p_strm->nalu_len + 3;
      if ((dxva_ctx->max_strm_size <= dxva_ctx->strm_offset + RVar2) &&
         (p_des._4_4_ = realloc_buffer(&dxva_ctx->bitstream,&dxva_ctx->max_strm_size,RVar2),
         p_des._4_4_ < MPP_OK)) {
        if ((h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x1b5);
        }
        goto LAB_001b9954;
      }
      pRVar3 = dxva_ctx->bitstream + dxva_ctx->strm_offset;
      pRVar3[0] = '\0';
      pRVar3[1] = '\0';
      pRVar3[2] = '\x01';
      memcpy(pRVar3 + 3,p_strm->nalu_buf,(ulong)p_strm->nalu_len);
      dxva_ctx->strm_offset = RVar2 + dxva_ctx->strm_offset;
    }
    if (((p_Cur->p_Dec->cfg->base).enable_hdr_meta != 0) && (p_strm->nalu_type == 0x1c)) {
      mpp_h264d_fill_dynamic_meta(p_Cur,p_strm->nalu_buf + 2,p_strm->nalu_len - 2,0xb);
    }
    if ((h264d_debug & 0x10000) != 0) {
      phVar1 = p_Cur->p_Inp;
      if ((p_strm->nalu_type == 7) || (p_strm->nalu_type == 8)) {
        if (phVar1->spspps_update_flag != 0) {
          pRVar3 = phVar1->spspps_buf + phVar1->spspps_offset;
          pRVar3[0] = '\0';
          pRVar3[1] = '\0';
          pRVar3[2] = '\x01';
          memcpy(pRVar3 + 3,p_strm->nalu_buf,(ulong)p_strm->nalu_len);
          phVar1->spspps_offset = phVar1->spspps_offset + p_strm->nalu_len + 3;
          phVar1->spspps_len = phVar1->spspps_offset;
        }
      }
      else if ((p_strm->nalu_type == 1) || (p_strm->nalu_type == 5)) {
        p_Cur->p_Inp->spspps_update_flag = 1;
        phVar1->spspps_offset = 0;
      }
    }
    p_Cur_local._4_4_ = MPP_OK;
  }
  return p_Cur_local._4_4_;
}

Assistant:

static MPP_RET store_cur_nalu(H264dCurCtx_t *p_Cur, H264dCurStream_t *p_strm, H264dDxvaCtx_t *dxva_ctx)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_U8 *p_des = NULL;

    //!< fill head buffer
    if (   (p_strm->nalu_type == H264_NALU_TYPE_SLICE)
           || (p_strm->nalu_type == H264_NALU_TYPE_IDR)
           || (p_strm->nalu_type == H264_NALU_TYPE_SPS)
           || (p_strm->nalu_type == H264_NALU_TYPE_PPS)
           || (p_strm->nalu_type == H264_NALU_TYPE_SUB_SPS)
           || (p_strm->nalu_type == H264_NALU_TYPE_SEI)
           || (p_strm->nalu_type == H264_NALU_TYPE_PREFIX)
           || (p_strm->nalu_type == H264_NALU_TYPE_SLC_EXT)) {

        RK_U32 head_size = MPP_MIN(HEAD_SYNTAX_MAX_SIZE, p_strm->nalu_len);
        RK_U32 add_size = head_size + sizeof(H264dNaluHead_t);

        //!< judge new frame
        if (p_strm->tmp_offset && !p_strm->head_offset) {
            memcpy(p_strm->head_buf, p_strm->tmp_buf, p_strm->tmp_offset);
            p_strm->head_offset += p_strm->tmp_offset;
            p_strm->tmp_offset = 0;

            H264D_LOG("copy tmp header to empty header of new frame");
        }

        if ((p_strm->head_offset + add_size) >= p_strm->head_max_size) {
            FUN_CHECK(ret = realloc_buffer(&p_strm->head_buf, &p_strm->head_max_size, add_size));
        }
        p_des = &p_strm->head_buf[p_strm->head_offset];
        ((H264dNaluHead_t *)p_des)->is_frame_end  = 0;
        ((H264dNaluHead_t *)p_des)->nalu_type = p_strm->nalu_type;
        ((H264dNaluHead_t *)p_des)->sodb_len = head_size;
        memcpy(p_des + sizeof(H264dNaluHead_t), p_strm->nalu_buf, head_size);
        p_strm->head_offset += add_size;

        H264D_LOG("store current header, NAL type %d", p_strm->nalu_type);

        // store NAL header except slice NAL
        if (p_Cur->p_Dec->have_slice_data && p_strm->nalu_type != H264_NALU_TYPE_IDR &&
            p_strm->nalu_type != H264_NALU_TYPE_SLICE) {
            RK_U8 *p_tmp = NULL;

            if ((p_strm->tmp_offset + add_size) >= p_strm->tmp_max_size) {
                FUN_CHECK(ret = realloc_buffer(&p_strm->tmp_buf, &p_strm->tmp_max_size, add_size));
            }

            p_tmp = &p_strm->tmp_buf[p_strm->tmp_offset];
            memcpy(p_tmp, p_des, add_size);
            p_strm->tmp_offset += add_size;

            H264D_LOG("store current header to tmp header, NAL type %d", p_strm->nalu_type);
        }
    }    //!< fill sodb buffer
    if ((p_strm->nalu_type == H264_NALU_TYPE_SLICE)
        || (p_strm->nalu_type == H264_NALU_TYPE_IDR)) {

        RK_U32 add_size = p_strm->nalu_len + sizeof(g_start_precode);

        if ((dxva_ctx->strm_offset + add_size) >= dxva_ctx->max_strm_size) {
            FUN_CHECK(ret = realloc_buffer(&dxva_ctx->bitstream, &dxva_ctx->max_strm_size, add_size));
        }

        p_des = &dxva_ctx->bitstream[dxva_ctx->strm_offset];
        memcpy(p_des, g_start_precode, sizeof(g_start_precode));
        memcpy(p_des + sizeof(g_start_precode), p_strm->nalu_buf, p_strm->nalu_len);
        dxva_ctx->strm_offset += add_size;
    }

    /* Dolby Vision RPUs masquerade as unregistered NALs of type 28. */
    if (p_Cur->p_Dec->cfg->base.enable_hdr_meta && p_strm->nalu_type == H264_NALU_TYPE_UNSPECIFIED28)
        mpp_h264d_fill_dynamic_meta(p_Cur, p_strm->nalu_buf + 2, p_strm->nalu_len - 2, DOLBY);

    if (h264d_debug & H264D_DBG_WRITE_ES_EN) {
        H264dInputCtx_t *p_Inp = p_Cur->p_Inp;
        if ((p_strm->nalu_type == H264_NALU_TYPE_SPS)
            || (p_strm->nalu_type == H264_NALU_TYPE_PPS)) {
            if (p_Inp->spspps_update_flag) {
                p_des = &p_Inp->spspps_buf[p_Inp->spspps_offset];
                memcpy(p_des, g_start_precode, sizeof(g_start_precode));
                memcpy(p_des + sizeof(g_start_precode), p_strm->nalu_buf, p_strm->nalu_len);
                p_Inp->spspps_offset += p_strm->nalu_len + sizeof(g_start_precode);
                p_Inp->spspps_len = p_Inp->spspps_offset;
            }
        } else if ((p_strm->nalu_type == H264_NALU_TYPE_SLICE)
                   || (p_strm->nalu_type == H264_NALU_TYPE_IDR)) {
            p_Cur->p_Inp->spspps_update_flag = 1;
            p_Inp->spspps_offset = 0;
        }
    }

    return ret = MPP_OK;
__FAILED:
    return ret;
}